

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int vscode_parse_intarg_request(json_value *js,ProtocolMessage *msg,int msgtype,char *key,FILE *log)

{
  int64_t iVar1;
  int local_44;
  json_value *pjStack_40;
  int found;
  json_value *args;
  FILE *log_local;
  char *key_local;
  ProtocolMessage *pPStack_20;
  int msgtype_local;
  ProtocolMessage *msg_local;
  json_value *js_local;
  
  args = (json_value *)log;
  log_local = (FILE *)key;
  key_local._4_4_ = msgtype;
  pPStack_20 = msg;
  msg_local = (ProtocolMessage *)js;
  pjStack_40 = get_object_value(js,"arguments",log);
  if (pjStack_40 == (json_value *)0x0) {
    js_local._4_4_ = -1;
  }
  else {
    local_44 = 0;
    iVar1 = get_int_value(pjStack_40,(char *)log_local,(FILE *)args,&local_44);
    *(int *)((long)&pPStack_20->u + 0x28) = (int)iVar1;
    (pPStack_20->u).Event.event_type = key_local._4_4_;
    js_local._4_4_ = key_local._4_4_;
  }
  return js_local._4_4_;
}

Assistant:

static int vscode_parse_intarg_request(json_value *js, ProtocolMessage *msg,
                                       int msgtype, const char *key,
                                       FILE *log) {
  json_value *args = get_object_value(js, "arguments", log);
  if (args == NULL) return VSCODE_UNKNOWN_REQUEST;
  int found = 0;
  msg->u.Request.u.CommonIntRequest.integer = (int)
      get_int_value(args, key, log, &found);
  msg->u.Request.request_type = msgtype;
  return msgtype;
}